

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

size_t file_stdio_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  int iVar1;
  USERDATA *pUVar2;
  size_t sVar3;
  int *piVar4;
  
  pUVar2 = get_userdata(f);
  if (size == 1) {
    iVar1 = fgetc((FILE *)pUVar2->fp);
    if (iVar1 == -1) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      pUVar2->errnum = iVar1;
      al_set_errno(iVar1);
      sVar3 = 0;
    }
    else {
      *(char *)ptr = (char)iVar1;
      sVar3 = 1;
    }
  }
  else {
    sVar3 = fread(ptr,1,size,(FILE *)pUVar2->fp);
    if (sVar3 < size) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      pUVar2->errnum = iVar1;
      al_set_errno(iVar1);
    }
  }
  return sVar3;
}

Assistant:

static size_t file_stdio_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   USERDATA *userdata = get_userdata(f);

   if (size == 1) {
      /* Optimise common case. */
      int c = fgetc(userdata->fp);
      if (c == EOF) {
         userdata->errnum = errno;
         al_set_errno(errno);
         return 0;
      }
      *((char *)ptr) = (char)c;
      return 1;
   }
   else {
      size_t ret = fread(ptr, 1, size, userdata->fp);
      if (ret < size) {
         userdata->errnum = errno;
         al_set_errno(errno);
      }
      return ret;
   }
}